

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_manager.cpp
# Opt level: O1

void __thiscall
duckdb::DatabaseManager::DetachDatabase
          (DatabaseManager *this,ClientContext *context,string *name,OnEntryNotFound if_not_found)

{
  size_t __n;
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  pointer this_00;
  BinderException *pBVar5;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  psVar4 = GetDefaultDatabase_abi_cxx11_(context);
  __n = psVar4->_M_string_length;
  if (__n == name->_M_string_length) {
    if (__n != 0) {
      iVar3 = bcmp((psVar4->_M_dataplus)._M_p,(name->_M_dataplus)._M_p,__n);
      if (iVar3 != 0) goto LAB_004d9faf;
    }
    pBVar5 = (BinderException *)__cxa_allocate_exception(0x10);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,
               "Cannot detach database \"%s\" because it is the default database. Select a different database using `USE` to allow detaching this database"
               ,"");
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    pcVar1 = (name->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar1,pcVar1 + name->_M_string_length);
    BinderException::BinderException<std::__cxx11::string>(pBVar5,&local_88,&local_48);
    __cxa_throw(pBVar5,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
LAB_004d9faf:
  this_00 = unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>::
            operator->(&this->databases);
  bVar2 = CatalogSet::DropEntry(this_00,context,name,false,true);
  if ((if_not_found == THROW_EXCEPTION) && (!bVar2)) {
    pBVar5 = (BinderException *)__cxa_allocate_exception(0x10);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"Failed to detach database with name \"%s\": database not found",
               "");
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    pcVar1 = (name->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar1,pcVar1 + name->_M_string_length);
    BinderException::BinderException<std::__cxx11::string>(pBVar5,&local_88,&local_68);
    __cxa_throw(pBVar5,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void DatabaseManager::DetachDatabase(ClientContext &context, const string &name, OnEntryNotFound if_not_found) {
	if (GetDefaultDatabase(context) == name) {
		throw BinderException("Cannot detach database \"%s\" because it is the default database. Select a different "
		                      "database using `USE` to allow detaching this database",
		                      name);
	}

	if (!databases->DropEntry(context, name, false, true)) {
		if (if_not_found == OnEntryNotFound::THROW_EXCEPTION) {
			throw BinderException("Failed to detach database with name \"%s\": database not found", name);
		}
	}
}